

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_add(mp_int *x,mp_int *y)

{
  mp_int *pmVar1;
  ulong uVar2;
  
  uVar2 = y->nw;
  if (y->nw < x->nw) {
    uVar2 = x->nw;
  }
  pmVar1 = mp_make_sized(uVar2 + 1);
  mp_add_masked_into(pmVar1->w,pmVar1->nw,x,y,0xffffffffffffffff,0,0);
  return pmVar1;
}

Assistant:

mp_int *mp_add(mp_int *x, mp_int *y)
{
    mp_int *r = mp_make_sized(size_t_max(x->nw, y->nw) + 1);
    mp_add_into(r, x, y);
    return r;
}